

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> __thiscall
wallet::MakeWalletDatabase
          (wallet *this,string *name,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error_string)

{
  T *path;
  long in_FS_OFFSET;
  bilingual_str bStack_b8;
  _Variant_storage<false,_bilingual_str,_fs::path> local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetWalletPath((Result<fs::path> *)&local_78,name);
  if (local_78._M_index == '\x01') {
    path = util::Result<fs::path>::value((Result<fs::path> *)&local_78);
    MakeDatabase(this,path,options,status,error_string);
  }
  else {
    util::ErrorString<fs::path>(&bStack_b8,(Result<fs::path> *)&local_78);
    bilingual_str::operator=(error_string,&bStack_b8);
    bilingual_str::~bilingual_str(&bStack_b8);
    *status = FAILED_BAD_PATH;
    *(undefined8 *)this = 0;
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
            (&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
            )(__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<WalletDatabase> MakeWalletDatabase(const std::string& name, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error_string)
{
    const auto& wallet_path = GetWalletPath(name);
    if (!wallet_path) {
        error_string = util::ErrorString(wallet_path);
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }
    return MakeDatabase(*wallet_path, options, status, error_string);
}